

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_common.c
# Opt level: O3

void jpegd_write_qp_ac_dc_table(JpegdHalCtx *ctx,JpegdSyntax *syntax)

{
  byte bVar1;
  RK_U32 RVar2;
  uint *puVar3;
  uint *puVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  AcTable *pAVar12;
  DcTable *pDVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  RK_U8 table_tmp [64];
  uint local_68 [18];
  
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_COMMON","enter\n","jpegd_write_qp_ac_dc_table");
  }
  puVar3 = (uint *)mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_qp_ac_dc_table");
  local_68[0xc] = 0;
  local_68[0xd] = 0;
  local_68[0xe] = 0;
  local_68[0xf] = 0;
  local_68[8] = 0;
  local_68[9] = 0;
  local_68[10] = 0;
  local_68[0xb] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  bVar1 = syntax->qtable_cnt;
  if ((ulong)bVar1 == 0) {
    uVar6 = 0;
  }
  else {
    uVar11 = 0;
    do {
      puVar4 = puVar3;
      uVar6 = syntax->quant_index[uVar11];
      lVar7 = 0;
      do {
        *(char *)((long)local_68 + (ulong)""[lVar7]) = (char)syntax->quant_matrixes[uVar6][lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x40);
      uVar14 = 0;
      do {
        uVar6 = *(uint *)((long)local_68 + uVar14);
        uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        *(uint *)((long)puVar4 + uVar14) = uVar6;
        uVar15 = uVar14 + 4;
        bVar16 = uVar14 < 0x3c;
        uVar14 = uVar15;
      } while (bVar16);
      uVar11 = uVar11 + 1;
      puVar3 = (uint *)((long)puVar4 + uVar15);
    } while (uVar11 != bVar1);
    puVar3 = (uint *)((long)puVar4 + uVar15);
  }
  RVar2 = syntax->ac_index[0];
  pAVar12 = syntax->ac_table + 1;
  if (RVar2 == 0) {
    pAVar12 = syntax->ac_table;
  }
  iVar10 = 0x20;
  uVar11 = 0;
  do {
    uVar8 = 0;
    if (uVar11 < pAVar12->actual_length) {
      uVar8 = (uint)(byte)pAVar12->vals[uVar11];
    }
    iVar5 = iVar10 + -8;
    uVar9 = uVar8 << ((byte)iVar5 & 0x1f) | uVar6;
    uVar6 = uVar8 << 0x18;
    if (iVar10 != 0x20) {
      uVar6 = uVar9;
    }
    iVar10 = iVar5;
    if (iVar5 == 0) {
      *puVar3 = uVar9;
      puVar3 = puVar3 + 1;
      iVar10 = 0x20;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0xa2);
  pAVar12 = syntax->ac_table;
  if (RVar2 == 0) {
    pAVar12 = syntax->ac_table + 1;
  }
  uVar11 = 0;
  do {
    uVar8 = 0;
    if ((syntax->yuv_mode != 0) && (uVar11 < pAVar12->actual_length)) {
      uVar8 = (uint)(byte)pAVar12->vals[uVar11];
    }
    iVar5 = iVar10 + -8;
    uVar9 = uVar8 << ((byte)iVar5 & 0x1f) | uVar6;
    uVar6 = uVar8 << 0x18;
    if (iVar10 != 0x20) {
      uVar6 = uVar9;
    }
    iVar10 = iVar5;
    if (iVar5 == 0) {
      *puVar3 = uVar9;
      puVar3 = puVar3 + 1;
      iVar10 = 0x20;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0xa2);
  RVar2 = syntax->dc_index[0];
  pDVar13 = syntax->dc_table + 1;
  if (RVar2 == 0) {
    pDVar13 = syntax->dc_table;
  }
  uVar11 = 0;
  do {
    uVar8 = 0;
    if (uVar11 < pDVar13->actual_length) {
      uVar8 = (uint)(byte)pDVar13->vals[uVar11];
    }
    iVar5 = iVar10 + -8;
    uVar9 = uVar8 << ((byte)iVar5 & 0x1f) | uVar6;
    uVar6 = uVar8 << 0x18;
    if (iVar10 != 0x20) {
      uVar6 = uVar9;
    }
    iVar10 = iVar5;
    if (iVar5 == 0) {
      *puVar3 = uVar9;
      puVar3 = puVar3 + 1;
      iVar10 = 0x20;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0xc);
  pDVar13 = syntax->dc_table;
  if (RVar2 == 0) {
    pDVar13 = syntax->dc_table + 1;
  }
  uVar11 = 0;
  do {
    uVar8 = 0;
    if ((syntax->yuv_mode != 0) && (uVar11 < pDVar13->actual_length)) {
      uVar8 = (uint)(byte)pDVar13->vals[uVar11];
    }
    iVar5 = iVar10 + -8;
    uVar9 = uVar8 << ((byte)iVar5 & 0x1f) | uVar6;
    uVar6 = uVar8 << 0x18;
    if (iVar10 != 0x20) {
      uVar6 = uVar9;
    }
    iVar10 = iVar5;
    if (iVar5 == 0) {
      *puVar3 = uVar9;
      puVar3 = puVar3 + 1;
      iVar10 = 0x20;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0xc);
  iVar5 = 4;
  do {
    uVar8 = uVar6;
    if (iVar10 == 0x20) {
      uVar8 = 0;
    }
    iVar10 = iVar10 + -8;
    if (iVar10 == 0) {
      *puVar3 = uVar6;
      puVar3 = puVar3 + 1;
      iVar10 = 0x20;
    }
    iVar5 = iVar5 + -1;
    uVar6 = uVar8;
  } while (iVar5 != 0);
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_COMMON","exit\n","jpegd_write_qp_ac_dc_table");
    return;
  }
  return;
}

Assistant:

void jpegd_write_qp_ac_dc_table(JpegdHalCtx *ctx,
                                JpegdSyntax*syntax)
{
    jpegd_dbg_func("enter\n");
    JpegdSyntax *s = syntax;
    RK_U32 *base = (RK_U32 *)mpp_buffer_get_ptr(ctx->pTableBase);
    RK_U8 table_tmp[QUANTIZE_TABLE_LENGTH] = {0};
    RK_U32 idx, table_word = 0, table_value = 0;
    RK_U32 shifter = 32;
    AcTable *ac_ptr0 = NULL, *ac_ptr1 = NULL;
    DcTable *dc_ptr0 = NULL, *dc_ptr1 = NULL;
    RK_U32 i, j = 0;

    /* Quantize tables for all components
     * length = 64 * 3  (Bytes)
     */
    for (j = 0; j < s->qtable_cnt; j++) {
        idx = s->quant_index[j]; /* quantize table index used by j component */

        for (i = 0; i < QUANTIZE_TABLE_LENGTH; i++) {
            table_tmp[zzOrder[i]] = (RK_U8) s->quant_matrixes[idx][i];
        }

        /* could memcpy be OK?? */
        for (i = 0; i < QUANTIZE_TABLE_LENGTH; i += 4) {
            /* transfer to big endian */
            table_word = (table_tmp[i] << 24) |
                         (table_tmp[i + 1] << 16) |
                         (table_tmp[i + 2] << 8) |
                         table_tmp[i + 3];
            *base = table_word;
            base++;
        }
    }

    /* write AC and DC tables
     * memory:  AC(Y) - AC(UV) - DC(Y) - DC(UV)
     * length = 162   + 162    + 12    + 12   (Bytes)
     */
    {
        /* this trick is done because hardware always wants
         * luma table as ac hardware table 0 */
        if (s->ac_index[0] == HUFFMAN_TABLE_ID_ZERO) {
            /* Luma's AC uses Huffman table zero */
            ac_ptr0 = &(s->ac_table[HUFFMAN_TABLE_ID_ZERO]);
            ac_ptr1 = &(s->ac_table[HUFFMAN_TABLE_ID_ONE]);
        } else {
            ac_ptr0 = &(s->ac_table[HUFFMAN_TABLE_ID_ONE]);
            ac_ptr1 = &(s->ac_table[HUFFMAN_TABLE_ID_ZERO]);
        }

        /* write luma AC table */
        for (i = 0; i < MAX_AC_HUFFMAN_TABLE_LENGTH; i++) {
            if (i < ac_ptr0->actual_length)
                table_value = (RK_U8) ac_ptr0->vals[i];
            else
                table_value = 0;

            /* transfer to big endian */
            if (shifter == 32)
                table_word = (table_value << (shifter - 8));
            else
                table_word |= (table_value << (shifter - 8));

            shifter -= 8;
            if (shifter == 0) {
                /* write 4 Bytes(32 bit) */
                *base = table_word;
                base++;
                shifter = 32;
            }
        }

        /* write chroma AC table */
        for (i = 0; i < MAX_AC_HUFFMAN_TABLE_LENGTH; i++) {
            /* chroma's AC table must be zero for YUV400 */
            if ((s->yuv_mode != JPEGDEC_YUV400) && (i < ac_ptr1->actual_length))
                table_value = (RK_U8) ac_ptr1->vals[i];
            else
                table_value = 0;

            /* transfer to big endian */
            if (shifter == 32)
                table_word = (table_value << (shifter - 8));
            else
                table_word |= (table_value << (shifter - 8));

            shifter -= 8;
            if (shifter == 0) {
                /* write 4 Bytes(32 bit) */
                *base = table_word;
                base++;
                shifter = 32;
            }
        }

        /* this trick is done because hardware always wants
         * luma table as dc hardware table 0 */
        if (s->dc_index[0] == HUFFMAN_TABLE_ID_ZERO) {
            /* Luma's DC uses Huffman table zero */
            dc_ptr0 = &(s->dc_table[HUFFMAN_TABLE_ID_ZERO]);
            dc_ptr1 = &(s->dc_table[HUFFMAN_TABLE_ID_ONE]);
        } else {
            dc_ptr0 = &(s->dc_table[HUFFMAN_TABLE_ID_ONE]);
            dc_ptr1 = &(s->dc_table[HUFFMAN_TABLE_ID_ZERO]);
        }

        /* write luma DC table */
        for (i = 0; i < MAX_DC_HUFFMAN_TABLE_LENGTH; i++) {
            if (i < dc_ptr0->actual_length)
                table_value = (RK_U8) dc_ptr0->vals[i];
            else
                table_value = 0;

            /* transfer to big endian */
            if (shifter == 32)
                table_word = (table_value << (shifter - 8));
            else
                table_word |= (table_value << (shifter - 8));

            shifter -= 8;
            if (shifter == 0) {
                /* write 4 Bytes(32 bit) */
                *base = table_word;
                base++;
                shifter = 32;
            }
        }

        /* write chroma DC table */
        for (i = 0; i < MAX_DC_HUFFMAN_TABLE_LENGTH; i++) {
            /* chroma's DC table must be zero for YUV400 */
            if ((s->yuv_mode != JPEGDEC_YUV400) && (i < dc_ptr1->actual_length))
                table_value = (RK_U8) dc_ptr1->vals[i];
            else
                table_value = 0;

            /* transfer to big endian */
            if (shifter == 32)
                table_word = (table_value << (shifter - 8));
            else
                table_word |= (table_value << (shifter - 8));

            shifter -= 8;
            if (shifter == 0) {
                /* write 4 Bytes(32 bit) */
                *base = table_word;
                base++;
                shifter = 32;
            }
        }
    }

    /* four-byte padding zero */
    for (i = 0; i < 4; i++) {
        table_value = 0;

        if (shifter == 32)
            table_word = (table_value << (shifter - 8));
        else
            table_word |= (table_value << (shifter - 8));

        shifter -= 8;

        if (shifter == 0) {
            *base = table_word;
            base++;
            shifter = 32;
        }
    }
    jpegd_dbg_func("exit\n");
    return;
}